

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PS2KeyboardAnalyzerSettings.cpp
# Opt level: O1

void __thiscall
PS2KeyboardAnalyzerSettings::PS2KeyboardAnalyzerSettings(PS2KeyboardAnalyzerSettings *this)

{
  Channel *this_00;
  Channel *this_01;
  AnalyzerSettingInterfaceChannel *pAVar1;
  AnalyzerSettingInterfaceNumberList *pAVar2;
  AnalyzerSettingInterfaceChannel *pAVar3;
  AnalyzerSettingInterfaceNumberList *this_02;
  ulong uVar4;
  Channel *pCVar5;
  uint uVar6;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__PS2KeyboardAnalyzerSettings_0010ed68;
  this_00 = &this->mClockChannel;
  Channel::Channel(this_00,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this_01 = &this->mDataChannel;
  uVar4 = 0xffffffffffffffff;
  Channel::Channel(this_01,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  (this->mDataChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  (this->mDeviceTypeInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  this->mDeviceType = 0.0;
  (this->mClockChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  pAVar3 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar4);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar3);
  pAVar1 = (this->mClockChannelInterface)._M_ptr;
  if (pAVar1 != pAVar3) {
    if (pAVar1 != (AnalyzerSettingInterfaceChannel *)0x0) {
      (**(code **)(*(long *)pAVar1 + 8))();
    }
    (this->mClockChannelInterface)._M_ptr = pAVar3;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip
            ((char *)(this->mClockChannelInterface)._M_ptr,"Clock");
  pCVar5 = this_00;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mClockChannelInterface)._M_ptr);
  pAVar3 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar5);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar3);
  pAVar1 = (this->mDataChannelInterface)._M_ptr;
  if (pAVar1 != pAVar3) {
    if (pAVar1 != (AnalyzerSettingInterfaceChannel *)0x0) {
      (**(code **)(*(long *)pAVar1 + 8))();
    }
    (this->mDataChannelInterface)._M_ptr = pAVar3;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)(this->mDataChannelInterface)._M_ptr,"Data");
  pCVar5 = this_01;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mDataChannelInterface)._M_ptr);
  this_02 = (AnalyzerSettingInterfaceNumberList *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar5);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(this_02);
  pAVar2 = (this->mDeviceTypeInterface)._M_ptr;
  if (pAVar2 != this_02) {
    if (pAVar2 != (AnalyzerSettingInterfaceNumberList *)0x0) {
      (**(code **)(*(long *)pAVar2 + 8))();
    }
    (this->mDeviceTypeInterface)._M_ptr = this_02;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip
            ((char *)(this->mDeviceTypeInterface)._M_ptr,"Device Type");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)(this->mDeviceTypeInterface)._M_ptr,"Keyboard");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)(this->mDeviceTypeInterface)._M_ptr,"Mouse (Standard PS/2)");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (2.0,(char *)(this->mDeviceTypeInterface)._M_ptr,"Mouse (IntelliMouse)");
  AnalyzerSettingInterfaceNumberList::SetNumber(this->mDeviceType);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar6 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar6,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar6,(char *)0x0,"text");
  AnalyzerSettings::AddExportOption(uVar6,(char *)0x1);
  AnalyzerSettings::AddExportExtension(uVar6,(char *)0x1,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_01,true);
  return;
}

Assistant:

PS2KeyboardAnalyzerSettings::PS2KeyboardAnalyzerSettings()
    : mClockChannel( UNDEFINED_CHANNEL ), mDataChannel( UNDEFINED_CHANNEL ), mDeviceType( 0 )
{
    mClockChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mClockChannelInterface->SetTitleAndTooltip( "Clock", "PS/2 - Clock" );
    mClockChannelInterface->SetChannel( mClockChannel );

    mDataChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mDataChannelInterface->SetTitleAndTooltip( "Data", "PS/2 - Data" );
    mDataChannelInterface->SetChannel( mDataChannel );

    mDeviceTypeInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mDeviceTypeInterface->SetTitleAndTooltip( "Device Type", "Device Type" );
    mDeviceTypeInterface->AddNumber( 0, "Keyboard", "Keyboard" );
    mDeviceTypeInterface->AddNumber( 1, "Mouse (Standard PS/2)", "Mouse (Standard PS/2)" );
    mDeviceTypeInterface->AddNumber( 2, "Mouse (IntelliMouse)", "Mouse (IntelliMouse)" );
    mDeviceTypeInterface->SetNumber( mDeviceType );

    AddInterface( mClockChannelInterface.get() );
    AddInterface( mDataChannelInterface.get() );
    AddInterface( mDeviceTypeInterface.get() );

    AddExportOption( 0, "Export captured keys as text file (Keyboard Only)" );
    AddExportExtension( 0, "text", "txt" );
    AddExportOption( 1, "Export data as .csv log file" );
    AddExportExtension( 1, "csv", "csv" );

    ClearChannels();
    AddChannel( mClockChannel, "PS/2 - Clock", false );
    AddChannel( mDataChannel, "PS/2 - Data", false );
}